

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O0

int __thiscall
RhombicLattice::neighbour(RhombicLattice *this,int vertexIndex,string *direction,int sign)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *piVar4;
  ostream *poVar5;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cartesian4 cVar6;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  cartesian4 coordinate;
  cartesian4 *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  cartesian4 *in_stack_fffffffffffffd78;
  Lattice *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffda8;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  cartesian4 local_1d8;
  ostringstream local_1c8 [380];
  cartesian4 local_4c;
  undefined8 local_3c;
  undefined8 local_34;
  int local_1c;
  
  if ((in_ECX != 1) && (in_ECX != -1)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Sign must be either 1 or -1.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1c = in_ECX;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  if ((((!bVar2) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58),
       !bVar2)) &&
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58), !bVar2)
      ) && (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58),
           !bVar2)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar6 = Lattice::indexToCoordinate
                    (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  local_4c._0_8_ = cVar6._0_8_;
  local_3c._0_4_ = local_4c.x;
  local_3c._4_4_ = local_4c.y;
  local_4c._8_8_ = cVar6._8_8_;
  local_34._0_4_ = local_4c.z;
  local_34._4_4_ = local_4c.w;
  uVar1 = local_34;
  local_34._4_4_ = cVar6.w;
  local_4c = cVar6;
  local_34 = uVar1;
  if (local_34._4_4_ == 1) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ + (uint)(0 < local_1c),(int)local_3c + (uint)(0 < local_1c)
                         );
      local_34 = (ulong)((int)local_34 + (uint)(local_1c < 0));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ + (uint)(local_1c < 0),(int)local_3c + (uint)(0 < local_1c)
                         );
      local_34 = (ulong)((int)local_34 + (uint)(0 < local_1c));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ + (uint)(0 < local_1c),(int)local_3c + (uint)(local_1c < 0)
                         );
      local_34 = (ulong)((int)local_34 + (uint)(0 < local_1c));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ + (uint)(0 < local_1c),(int)local_3c + (uint)(0 < local_1c)
                         );
      local_34 = (ulong)((int)local_34 + (uint)(0 < local_1c));
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ - (uint)(local_1c < 0),(int)local_3c - (uint)(local_1c < 0)
                         );
      local_34 = CONCAT44(1,(int)local_34 - (uint)(0 < local_1c));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ - (uint)(0 < local_1c),(int)local_3c - (uint)(local_1c < 0)
                         );
      local_34 = CONCAT44(1,(int)local_34 - (uint)(local_1c < 0));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ - (uint)(local_1c < 0),(int)local_3c - (uint)(0 < local_1c)
                         );
      local_34 = CONCAT44(1,(int)local_34 - (uint)(local_1c < 0));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ - (uint)(local_1c < 0),(int)local_3c - (uint)(local_1c < 0)
                         );
      local_34 = CONCAT44(1,(int)local_34 - (uint)(local_1c < 0));
    }
  }
  if ((((-1 < (int)local_3c) && ((int)local_3c < *(int *)(in_RDI + 8))) &&
      ((-1 < local_3c && ((local_3c._4_4_ < *(int *)(in_RDI + 8) && (-1 < (int)local_34)))))) &&
     ((int)local_34 < *(int *)(in_RDI + 8))) {
    iVar3 = Lattice::coordinateToIndex(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    return iVar3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  local_1d8 = Lattice::indexToCoordinate
                        (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  std::__cxx11::string::string(local_1f8);
  if (local_1c == 1) {
    std::operator+(in_stack_fffffffffffffda8,in_RDI);
    std::__cxx11::string::operator=(local_1f8,local_218);
    std::__cxx11::string::~string(local_218);
  }
  else if (local_1c == -1) {
    std::operator+(in_stack_fffffffffffffda8,in_RDI);
    std::__cxx11::string::operator=(local_1f8,local_238);
    std::__cxx11::string::~string(local_238);
  }
  poVar5 = std::operator<<((ostream *)local_1c8,"RhombicLattice::neighbour, ");
  poVar5 = std::operator<<(poVar5,local_1f8);
  std::operator<<(poVar5," neighbour of ");
  poVar5 = operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::operator<<(poVar5," is outside the lattice.");
  std::__cxx11::ostringstream::str();
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffda8);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int RhombicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.y = (coordinate.y + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.x = (coordinate.x + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.y = (coordinate.y - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.x = (coordinate.x - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.w = 1;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "RhombicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}